

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O0

size_t __thiscall
FlatFileSeq::Allocate(FlatFileSeq *this,FlatFilePos *pos,size_t add_size,bool *out_of_space)

{
  ulong uVar1;
  string_view source_file;
  bool bVar2;
  ConstevalFormatString<3U> fmt;
  size_t sVar3;
  FILE *__stream;
  undefined1 *in_RCX;
  long in_RDX;
  char *unaff_RBX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  FILE *file;
  size_t inc_size;
  size_t old_size;
  uint n_new_chunks;
  uint n_old_chunks;
  size_t new_size;
  Level in_stack_000000e0;
  unsigned_long *in_stack_000000f0;
  char **in_stack_000000f8;
  int *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  FILE *in_stack_ffffffffffffff48;
  path *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  int source_line;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 read_only;
  FlatFilePos *in_stack_ffffffffffffffc8;
  FlatFileSeq *in_stack_ffffffffffffffd0;
  size_t sVar4;
  
  read_only = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  sVar4 = *(size_t *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  uVar1 = (((ulong)*(uint *)(in_RSI + 4) + in_RDX + *(long *)(in_RDI + 0x30)) - 1) /
          *(ulong *)(in_RDI + 0x30);
  if ((uint)((((ulong)*(uint *)(in_RSI + 4) + *(long *)(in_RDI + 0x30)) - 1) /
            *(ulong *)(in_RDI + 0x30)) < (uint)uVar1) {
    fmt.fmt = (char *)((uVar1 & 0xffffffff) * *(long *)(in_RDI + 0x30));
    sVar3 = (long)fmt.fmt - (ulong)*(uint *)(in_RSI + 4);
    bVar2 = CheckDiskSpace(in_stack_ffffffffffffff50,(uint64_t)in_stack_ffffffffffffff48);
    source_line = (int)((ulong)in_RDX >> 0x20);
    if (bVar2) {
      __stream = (FILE *)Open(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)read_only);
      if (__stream != (FILE *)0x0) {
        bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                    Trace);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff48 = (FILE *)&stack0xffffffffffffffe8;
          in_stack_ffffffffffffff40 = "Pre-allocating up to position 0x%x in %s%05u.dat\n";
          source_file._M_str = unaff_RBX;
          source_file._M_len = sVar4;
          LogPrintFormatInternal<unsigned_long,char_const*,int>
                    (in_stack_00000000,source_file,source_line,(LogFlags)in_RCX,in_stack_000000e0,
                     fmt,in_stack_000000f0,in_stack_000000f8,in_stack_00000100);
        }
        AllocateFileRange(in_stack_ffffffffffffff48,(uint)((ulong)in_stack_ffffffffffffff40 >> 0x20)
                          ,(uint)in_stack_ffffffffffffff40);
        fclose(__stream);
        goto LAB_00f36a5b;
      }
    }
    else {
      *in_RCX = 1;
    }
  }
  sVar3 = 0;
LAB_00f36a5b:
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar4) {
    __stack_chk_fail();
  }
  return sVar3;
}

Assistant:

size_t FlatFileSeq::Allocate(const FlatFilePos& pos, size_t add_size, bool& out_of_space) const
{
    out_of_space = false;

    unsigned int n_old_chunks = (pos.nPos + m_chunk_size - 1) / m_chunk_size;
    unsigned int n_new_chunks = (pos.nPos + add_size + m_chunk_size - 1) / m_chunk_size;
    if (n_new_chunks > n_old_chunks) {
        size_t old_size = pos.nPos;
        size_t new_size = n_new_chunks * m_chunk_size;
        size_t inc_size = new_size - old_size;

        if (CheckDiskSpace(m_dir, inc_size)) {
            FILE *file = Open(pos);
            if (file) {
                LogDebug(BCLog::VALIDATION, "Pre-allocating up to position 0x%x in %s%05u.dat\n", new_size, m_prefix, pos.nFile);
                AllocateFileRange(file, pos.nPos, inc_size);
                fclose(file);
                return inc_size;
            }
        } else {
            out_of_space = true;
        }
    }
    return 0;
}